

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall
chaiscript::detail::Dispatch_Engine::add_function
          (Dispatch_Engine *this,Proxy_Function *t_f,string *t_name)

{
  Proxy_Function new_func;
  unique_lock<chaiscript::detail::threading::shared_mutex> l;
  undefined1 auStack_58 [16];
  Boxed_Value local_48;
  Proxy_Function *local_38;
  unique_lock<std::shared_mutex> local_30;
  
  local_30._M_owns = false;
  local_30._M_device = &this->m_mutex;
  std::unique_lock<std::shared_mutex>::lock(&local_30);
  local_30._M_owns = true;
  local_48.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  local_48.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)t_name;
  local_38 = t_f;
  add_function::anon_class_24_3_eefc95ea::operator()((anon_class_24_3_eefc95ea *)auStack_58);
  const_var_impl<chaiscript::dispatch::Proxy_Function_Base>
            ((detail *)&local_48,(shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)auStack_58
            );
  utility::
  QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>
  ::insert_or_assign<chaiscript::Boxed_Value>(&(this->m_state).m_boxed_functions,t_name,&local_48);
  if ((string *)
      local_48.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  utility::
  QuickFlatMap<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,chaiscript::str_equal>
  ::insert_or_assign<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>>
            ((QuickFlatMap<std::__cxx11::string,std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base>,chaiscript::str_equal>
              *)&(this->m_state).m_function_objects,t_name,
             (shared_ptr<chaiscript::dispatch::Proxy_Function_Base> *)auStack_58);
  if ((string *)auStack_58._8_8_ != (string *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_58._8_8_);
  }
  std::unique_lock<std::shared_mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void add_function(const Proxy_Function &t_f, const std::string &t_name) {
        chaiscript::detail::threading::unique_lock<chaiscript::detail::threading::shared_mutex> l(m_mutex);

        Proxy_Function new_func = [&]() -> Proxy_Function {
          auto &funcs = get_functions_int();
          auto itr = funcs.find(t_name);

          if (itr != funcs.end()) {
            auto vec = *itr->second;
            for (const auto &func : vec) {
              if ((*t_f) == *(func)) {
                throw chaiscript::exception::name_conflict_error(t_name);
              }
            }

            vec.reserve(vec.size() + 1); // tightly control vec growth
            vec.push_back(t_f);
            std::stable_sort(vec.begin(), vec.end(), &function_less_than);
            itr->second = std::make_shared<std::vector<Proxy_Function>>(vec);
            return std::make_shared<Dispatch_Function>(std::move(vec));
          } else if (t_f->has_arithmetic_param()) {
            // if the function is the only function but it also contains
            // arithmetic operators, we must wrap it in a dispatch function
            // to allow for automatic arithmetic type conversions
            std::vector<Proxy_Function> vec;
            vec.push_back(t_f);
            funcs.insert(std::pair{t_name, std::make_shared<std::vector<Proxy_Function>>(vec)});
            return std::make_shared<Dispatch_Function>(std::move(vec));
          } else {
            auto vec = std::make_shared<std::vector<Proxy_Function>>();
            vec->push_back(t_f);
            funcs.insert(std::pair{t_name, vec});
            return t_f;
          }
        }();

        get_boxed_functions_int().insert_or_assign(t_name, const_var(new_func));
        get_function_objects_int().insert_or_assign(t_name, std::move(new_func));
      }